

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_extra_test.cc
# Opt level: O2

void __thiscall EVPExtraTest_TLSEncodedPoint_Test::TestBody(EVPExtraTest_TLSEncodedPoint_Test *this)

{
  bool bVar1;
  AssertionResult *pAVar2;
  int iVar3;
  uint8_t *puVar4;
  long lVar5;
  char *pcVar6;
  char *in_R9;
  int *message;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  ScopedTrace gtest_trace_1200;
  ScopedTrace gtest_trace_1199;
  Bytes local_1d8;
  AssertionResult gtest_ar__5;
  UniquePtr<EVP_PKEY> from_spki;
  UniquePtr<EVP_PKEY> from_encoded_point;
  AssertionResult gtest_ar_;
  AssertHelper local_150;
  size_t len;
  uint8_t *data;
  ScopedCBB cbb;
  anon_struct_56_3_7c433676 kTests [2];
  CBS spki;
  
  kTests[0].pkey_type = 0x198;
  memcpy(&cbb,&DAT_004af0b0,0x5b);
  __l._M_len = 0x5b;
  __l._M_array = (iterator)&cbb;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kTests[0].spki,__l,(allocator_type *)&local_1d8);
  memcpy(&gtest_ar_,&DAT_004af10b,0x41);
  __l_00._M_len = 0x41;
  __l_00._M_array = &gtest_ar_.success_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kTests[0].encoded_point,__l_00,(allocator_type *)&from_spki);
  kTests[1].pkey_type = 0x3b4;
  spki.data = (uint8_t *)0x652b030605302a30;
  spki.len = 0x6768dbe60021036e;
  __l_01._M_len = 0x2c;
  __l_01._M_array = (iterator)&spki;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kTests[1].spki,__l_01,(allocator_type *)&data);
  gtest_ar__5.success_ = true;
  gtest_ar__5._1_7_ = 0xdb3030586768db;
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x7c5fb124a4c19435;
  __l_02._M_len = 0x20;
  __l_02._M_array = &gtest_ar__5.success_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kTests[1].encoded_point,__l_02,(allocator_type *)&len);
  lVar5 = 0;
  do {
    if (lVar5 == 0x70) break;
    message = (int *)((long)&kTests[0].pkey_type + lVar5);
    testing::ScopedTrace::ScopedTrace<int>
              (&gtest_trace_1199,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
               ,0x4af,message);
    cbb.ctx_.child =
         *(CBB **)((long)&kTests[0].spki.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar5);
    cbb.ctx_._8_8_ =
         *(long *)((long)&kTests[0].spki.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish + lVar5) - (long)cbb.ctx_.child;
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&gtest_trace_1200,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
               ,0x4b0,(Bytes *)&cbb);
    spki.data = *(uint8_t **)
                 ((long)&kTests[0].spki.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar5);
    spki.len = *(long *)((long)&kTests[0].spki.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish + lVar5) - (long)spki.data
    ;
    from_spki._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
         EVP_parse_public_key(&spki);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
         from_spki._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
         (_Head_base<0UL,_evp_pkey_st_*,_false>)0x0;
    if ((tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
        from_spki._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
        (_Head_base<0UL,_evp_pkey_st_*,_false>)0x0) {
      testing::Message::Message((Message *)&gtest_ar__5);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&cbb,(internal *)&gtest_ar_,(AssertionResult *)"from_spki","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                 ,0x4b4,(char *)cbb.ctx_.child);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&gtest_ar__5)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
      std::__cxx11::string::~string((string *)&cbb);
      if (gtest_ar__5._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar__5._0_8_ + 8))();
      }
      pAVar2 = &gtest_ar_;
LAB_00251f31:
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&pAVar2->message_);
      std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&from_spki);
      testing::ScopedTrace::~ScopedTrace(&gtest_trace_1200);
      testing::ScopedTrace::~ScopedTrace(&gtest_trace_1199);
      break;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    len = EVP_PKEY_get1_tls_encodedpoint
                    ((EVP_PKEY *)
                     from_spki._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t
                     .super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,&data);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
              ((internal *)&cbb,"len","0u",&len,(uint *)&gtest_ar_);
    if ((char)cbb.ctx_.child == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      if (cbb.ctx_._8_8_ == 0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)cbb.ctx_._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__5,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                 ,0x4b8,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5,(Message *)&gtest_ar_)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      pAVar2 = (AssertionResult *)&cbb;
      goto LAB_00251f31;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cbb.ctx_.is_child);
    gtest_ar_._0_8_ = data;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )len;
    gtest_ar__5._0_8_ =
         *(long *)((long)&kTests[0].encoded_point.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar5);
    gtest_ar__5.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(*(long *)((long)&kTests[0].encoded_point.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish + lVar5) - gtest_ar__5._0_8_)
    ;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)&cbb,"Bytes(data, len)","Bytes(test.encoded_point)",(Bytes *)&gtest_ar_,
               (Bytes *)&gtest_ar__5);
    if ((char)cbb.ctx_.child == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar6 = "";
      if (cbb.ctx_._8_8_ != 0) {
        pcVar6 = *(char **)cbb.ctx_._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__5,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                 ,0x4b9,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5,(Message *)&gtest_ar_)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cbb.ctx_.is_child);
    OPENSSL_free(data);
    from_encoded_point._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)EVP_PKEY_new();
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
         from_encoded_point._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
         (_Head_base<0UL,_evp_pkey_st_*,_false>)0x0;
    if ((tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
        from_encoded_point._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
        (_Head_base<0UL,_evp_pkey_st_*,_false>)0x0) {
      testing::Message::Message((Message *)&gtest_ar__5);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&cbb,(internal *)&gtest_ar_,(AssertionResult *)"from_encoded_point",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                 ,0x4bd,(char *)cbb.ctx_.child);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&gtest_ar__5)
      ;
LAB_00251cd0:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
      std::__cxx11::string::~string((string *)&cbb);
      if (gtest_ar__5._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar__5._0_8_ + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      bVar1 = false;
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      iVar3 = *message;
      if (iVar3 != 0x198) {
        iVar3 = EVP_PKEY_set_type((EVP_PKEY *)
                                  from_encoded_point._M_t.
                                  super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,iVar3);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar3 != 0;
        if (iVar3 != 0) goto LAB_00251aa2;
        testing::Message::Message((Message *)&gtest_ar__5);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&cbb,(internal *)&gtest_ar_,
                   (AssertionResult *)"EVP_PKEY_set_type(from_encoded_point.get(), test.pkey_type)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                   ,0x4c4,(char *)cbb.ctx_.child);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_1d8,(Message *)&gtest_ar__5);
        goto LAB_00251cd0;
      }
      iVar3 = EVP_PKEY_copy_parameters
                        ((EVP_PKEY *)
                         from_encoded_point._M_t.
                         super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,
                         (EVP_PKEY *)
                         from_spki._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar3 != 0;
      if (iVar3 == 0) {
        testing::Message::Message((Message *)&gtest_ar__5);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&cbb,(internal *)&gtest_ar_,
                   (AssertionResult *)
                   "EVP_PKEY_copy_parameters(from_encoded_point.get(), from_spki.get())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                   ,0x4c2,(char *)cbb.ctx_.child);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_1d8,(Message *)&gtest_ar__5);
        goto LAB_00251cd0;
      }
LAB_00251aa2:
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      puVar4 = *(uint8_t **)
                ((long)&kTests[0].encoded_point.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar5);
      iVar3 = EVP_PKEY_set1_tls_encodedpoint
                        ((EVP_PKEY *)
                         from_encoded_point._M_t.
                         super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,puVar4,
                         *(long *)((long)&kTests[0].encoded_point.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish + lVar5) -
                         (long)puVar4);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar3 != 0;
      if (iVar3 == 0) {
        testing::Message::Message((Message *)&gtest_ar__5);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&cbb,(internal *)&gtest_ar_,
                   (AssertionResult *)
                   "EVP_PKEY_set1_tls_encodedpoint(from_encoded_point.get(), test.encoded_point.data(), test.encoded_point.size())"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                   ,0x4c8,(char *)cbb.ctx_.child);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_1d8,(Message *)&gtest_ar__5);
        goto LAB_00251cd0;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      CBB_zero(&cbb.ctx_);
      iVar3 = CBB_init(&cbb.ctx_,
                       *(long *)((long)&kTests[0].spki.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + lVar5) -
                       *(long *)((long)&kTests[0].spki.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar5));
      gtest_ar__5.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__5.success_ = iVar3 != 0;
      if (iVar3 == 0) {
        testing::Message::Message((Message *)&local_1d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
                   (AssertionResult *)"CBB_init(cbb.get(), test.spki.size())","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                   ,0x4cb,(char *)gtest_ar_._0_8_);
        testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_1d8);
LAB_00251dbb:
        testing::internal::AssertHelper::~AssertHelper(&local_150);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        if ((long *)local_1d8.span_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_1d8.span_.data_ + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__5.message_);
        bVar1 = false;
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__5.message_);
        iVar3 = EVP_marshal_public_key
                          (&cbb.ctx_,
                           (EVP_PKEY *)
                           from_encoded_point._M_t.
                           super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
        gtest_ar__5.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__5.success_ = iVar3 != 0;
        if (iVar3 == 0) {
          testing::Message::Message((Message *)&local_1d8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
                     (AssertionResult *)
                     "EVP_marshal_public_key(cbb.get(), from_encoded_point.get())","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                     ,0x4cc,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_1d8);
          goto LAB_00251dbb;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__5.message_);
        puVar4 = CBB_data(&cbb.ctx_);
        gtest_ar__5.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )CBB_len(&cbb.ctx_);
        local_1d8.span_.data_ =
             *(uchar **)
              ((long)&kTests[0].spki.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar5);
        local_1d8.span_.size_ =
             *(long *)((long)&kTests[0].spki.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish + lVar5) -
             (long)local_1d8.span_.data_;
        gtest_ar__5._0_8_ = puVar4;
        testing::internal::CmpHelperEQ<Bytes,Bytes>
                  ((internal *)&gtest_ar_,"Bytes(CBB_data(cbb.get()), CBB_len(cbb.get()))",
                   "Bytes(test.spki)",(Bytes *)&gtest_ar__5,&local_1d8);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar__5);
          pcVar6 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar6 = *(char **)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_1d8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                     ,0x4cd,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_1d8,(Message *)&gtest_ar__5);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
          if (gtest_ar__5._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar__5._0_8_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        bVar1 = true;
      }
      bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated(&cbb);
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&from_encoded_point);
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&from_spki);
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_1200);
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_1199);
    lVar5 = lVar5 + 0x38;
  } while (bVar1);
  lVar5 = 0x38;
  do {
    TestBody()::$_0::~__0((__0 *)((long)&kTests[0].pkey_type + lVar5));
    lVar5 = lVar5 + -0x38;
  } while (lVar5 != -0x38);
  return;
}

Assistant:

TEST(EVPExtraTest, TLSEncodedPoint) {
  const struct {
    int pkey_type;
    std::vector<uint8_t> spki;
    std::vector<uint8_t> encoded_point;
  } kTests[] = {
      {EVP_PKEY_EC,
       {0x30, 0x59, 0x30, 0x13, 0x06, 0x07, 0x2a, 0x86, 0x48, 0xce, 0x3d, 0x02,
        0x01, 0x06, 0x08, 0x2a, 0x86, 0x48, 0xce, 0x3d, 0x03, 0x01, 0x07, 0x03,
        0x42, 0x00, 0x04, 0x2c, 0x15, 0x0f, 0x42, 0x9c, 0xe7, 0x0f, 0x21, 0x6c,
        0x25, 0x2c, 0xf5, 0xe0, 0x62, 0xce, 0x1f, 0x63, 0x9c, 0xd5, 0xd1, 0x65,
        0xc7, 0xf8, 0x94, 0x24, 0x07, 0x2c, 0x27, 0x19, 0x7d, 0x78, 0xb3, 0x3b,
        0x92, 0x0e, 0x95, 0xcd, 0xb6, 0x64, 0xe9, 0x90, 0xdc, 0xf0, 0xcf, 0xea,
        0x0d, 0x94, 0xe2, 0xa8, 0xe6, 0xaf, 0x9d, 0x0e, 0x58, 0x05, 0x6e, 0x65,
        0x31, 0x04, 0x92, 0x5b, 0x9f, 0xe6, 0xc9},
       {0x04, 0x2c, 0x15, 0x0f, 0x42, 0x9c, 0xe7, 0x0f, 0x21, 0x6c, 0x25,
        0x2c, 0xf5, 0xe0, 0x62, 0xce, 0x1f, 0x63, 0x9c, 0xd5, 0xd1, 0x65,
        0xc7, 0xf8, 0x94, 0x24, 0x07, 0x2c, 0x27, 0x19, 0x7d, 0x78, 0xb3,
        0x3b, 0x92, 0x0e, 0x95, 0xcd, 0xb6, 0x64, 0xe9, 0x90, 0xdc, 0xf0,
        0xcf, 0xea, 0x0d, 0x94, 0xe2, 0xa8, 0xe6, 0xaf, 0x9d, 0x0e, 0x58,
        0x05, 0x6e, 0x65, 0x31, 0x04, 0x92, 0x5b, 0x9f, 0xe6, 0xc9}},
      {EVP_PKEY_X25519,
       {0x30, 0x2a, 0x30, 0x05, 0x06, 0x03, 0x2b, 0x65, 0x6e, 0x03, 0x21,
        0x00, 0xe6, 0xdb, 0x68, 0x67, 0x58, 0x30, 0x30, 0xdb, 0x35, 0x94,
        0xc1, 0xa4, 0x24, 0xb1, 0x5f, 0x7c, 0x72, 0x66, 0x24, 0xec, 0x26,
        0xb3, 0x35, 0x3b, 0x10, 0xa9, 0x03, 0xa6, 0xd0, 0xab, 0x1c, 0x4c},
       {0xe6, 0xdb, 0x68, 0x67, 0x58, 0x30, 0x30, 0xdb, 0x35, 0x94, 0xc1,
        0xa4, 0x24, 0xb1, 0x5f, 0x7c, 0x72, 0x66, 0x24, 0xec, 0x26, 0xb3,
        0x35, 0x3b, 0x10, 0xa9, 0x03, 0xa6, 0xd0, 0xab, 0x1c, 0x4c}}};
  for (const auto& test : kTests) {
    SCOPED_TRACE(test.pkey_type);
    SCOPED_TRACE(Bytes(test.spki));
    CBS spki;
    CBS_init(&spki, test.spki.data(), test.spki.size());
    bssl::UniquePtr<EVP_PKEY> from_spki(EVP_parse_public_key(&spki));
    ASSERT_TRUE(from_spki);

    uint8_t *data;
    size_t len = EVP_PKEY_get1_tls_encodedpoint(from_spki.get(), &data);
    ASSERT_GT(len, 0u);
    EXPECT_EQ(Bytes(data, len), Bytes(test.encoded_point));
    OPENSSL_free(data);

    bssl::UniquePtr<EVP_PKEY> from_encoded_point(EVP_PKEY_new());
    ASSERT_TRUE(from_encoded_point);
    if (test.pkey_type == EVP_PKEY_EC) {
      // |EVP_PKEY_EC| should have been |EVP_PKEY_EC_P256|, etc., but instead
      // part of the type is buried inside parameters.
      ASSERT_TRUE(
          EVP_PKEY_copy_parameters(from_encoded_point.get(), from_spki.get()));
    } else {
      ASSERT_TRUE(EVP_PKEY_set_type(from_encoded_point.get(), test.pkey_type));
    }
    ASSERT_TRUE(EVP_PKEY_set1_tls_encodedpoint(from_encoded_point.get(),
                                               test.encoded_point.data(),
                                               test.encoded_point.size()));

    bssl::ScopedCBB cbb;
    ASSERT_TRUE(CBB_init(cbb.get(), test.spki.size()));
    ASSERT_TRUE(EVP_marshal_public_key(cbb.get(), from_encoded_point.get()));
    EXPECT_EQ(Bytes(CBB_data(cbb.get()), CBB_len(cbb.get())), Bytes(test.spki));
  }
}